

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

cl_int clSetKernelArgMemPointerINTEL(cl_kernel kernel,cl_uint arg_index,void *arg_value)

{
  _Rb_tree_header *p_Var1;
  uint64_t enqueueCounter;
  CLIntercept *this;
  byte bVar2;
  cl_int errorCode;
  cl_platform_id p_Var3;
  mapped_type *pmVar4;
  time_point end;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  time_point local_60;
  cl_context context;
  _cl_context local_48 [16];
  uint64_t local_38;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x30;
  }
  context = (cl_context)0x0;
  (*(g_pIntercept->m_Dispatch).clGetKernelInfo)(kernel,0x1193,8,&context,(size_t *)0x0);
  p_Var3 = CLIntercept::getPlatform(this,context);
  p_Var5 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 == (_Base_ptr)0x0) {
LAB_0013b1e9:
    context = (cl_context)0x0;
    pmVar4 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)&context);
  }
  else {
    p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(cl_platform_id *)(p_Var5 + 1) >= p_Var3) {
        p_Var6 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(cl_platform_id *)(p_Var5 + 1) < p_Var3];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 == p_Var1) || (p_Var3 < *(cl_platform_id *)(p_Var6 + 1)))
    goto LAB_0013b1e9;
    pmVar4 = (mapped_type *)&p_Var6[1]._M_parent;
  }
  if (pmVar4->clSetKernelArgMemPointerINTEL == (_func_cl_int_cl_kernel_cl_uint_void_ptr *)0x0) {
    return -0x30;
  }
  enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (this,"clSetKernelArgMemPointerINTEL",enqueueCounter,kernel,
               "kernel = %p, index = %u, value = %p",kernel,(ulong)arg_index,arg_value);
  }
  if ((this->m_Config).USMChecking == true) {
    CLIntercept::checkKernelArgUSMPointer(this,kernel,arg_value);
  }
  if (((((this->m_Config).DumpBuffersBeforeEnqueue != false) ||
       ((this->m_Config).DumpBuffersAfterEnqueue != false)) ||
      ((this->m_Config).InjectBuffers != false)) ||
     (((this->m_Config).InjectImages != false || ((this->m_Config).CaptureReplay == true)))) {
    CLIntercept::setKernelArgUSMPointer(this,kernel,arg_index,arg_value);
  }
  local_38 = enqueueCounter;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_60.__d.__r = (duration)0;
  }
  else {
    local_60.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pmVar4->clSetKernelArgMemPointerINTEL)(kernel,arg_index,arg_value);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_38 &&
        (local_38 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      context = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)&context,"");
      CLIntercept::updateHostTimingStats
                (this,"clSetKernelArgMemPointerINTEL",(string *)&context,local_60,end);
      if (context != local_48) {
        operator_delete(context);
      }
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar2 = (this->m_Config).ErrorAssert;
    if ((bool)bVar2 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_0013b3d1;
    }
    else if (errorCode == 0) goto LAB_0013b3a6;
  }
  else {
    if (errorCode == 0) {
LAB_0013b3a6:
      errorCode = 0;
      goto LAB_0013b3d1;
    }
    CLIntercept::logError(this,"clSetKernelArgMemPointerINTEL",errorCode);
    bVar2 = (this->m_Config).ErrorAssert;
  }
  if ((bVar2 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_0013b3d1:
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clSetKernelArgMemPointerINTEL",errorCode,(cl_event *)0x0,
               (cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    context = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&context,"");
    CLIntercept::chromeCallLoggingExit
              (this,"clSetKernelArgMemPointerINTEL",(string *)&context,false,0,local_60,end);
    if (context != local_48) {
      operator_delete(context);
    }
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clSetKernelArgMemPointerINTEL(
    cl_kernel kernel,
    cl_uint arg_index,
    const void* arg_value)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(kernel);
        if( dispatchX.clSetKernelArgMemPointerINTEL )
        {
            GET_ENQUEUE_COUNTER();
            CALL_LOGGING_ENTER_KERNEL(
                kernel,
                "kernel = %p, index = %u, value = %p",
                kernel,
                arg_index,
                arg_value );
            CHECK_KERNEL_ARG_USM_POINTER( kernel, arg_value );
            SET_KERNEL_ARG_USM_POINTER( kernel, arg_index, arg_value );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clSetKernelArgMemPointerINTEL(
                kernel,
                arg_index,
                arg_value );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            CALL_LOGGING_EXIT( retVal );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_KERNEL);
}